

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariter.cpp
# Opt level: O0

void __thiscall
icu_63::CharacterIterator::CharacterIterator
          (CharacterIterator *this,int32_t length,int32_t textBegin,int32_t textEnd,int32_t position
          )

{
  int32_t position_local;
  int32_t textEnd_local;
  int32_t textBegin_local;
  int32_t length_local;
  CharacterIterator *this_local;
  
  ForwardCharacterIterator::ForwardCharacterIterator(&this->super_ForwardCharacterIterator);
  (this->super_ForwardCharacterIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__CharacterIterator_0050d388;
  this->textLength = length;
  this->pos = position;
  this->begin = textBegin;
  this->end = textEnd;
  if (this->textLength < 0) {
    this->textLength = 0;
  }
  if (this->begin < 0) {
    this->begin = 0;
  }
  else if (this->textLength < this->begin) {
    this->begin = this->textLength;
  }
  if (this->end < this->begin) {
    this->end = this->begin;
  }
  else if (this->textLength < this->end) {
    this->end = this->textLength;
  }
  if (this->pos < this->begin) {
    this->pos = this->begin;
  }
  else if (this->end < this->pos) {
    this->pos = this->end;
  }
  return;
}

Assistant:

CharacterIterator::CharacterIterator(int32_t length, int32_t textBegin, int32_t textEnd, int32_t position)
: textLength(length), pos(position), begin(textBegin), end(textEnd) {
    if(textLength < 0) {
        textLength = 0;
    }
    if(begin < 0) {
        begin = 0;
    } else if(begin > textLength) {
        begin = textLength;
    }
    if(end < begin) {
        end = begin;
    } else if(end > textLength) {
        end = textLength;
    }
    if(pos < begin) {
        pos = begin;
    } else if(pos > end) {
        pos = end;
    }
}